

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

void __thiscall Hpipe::anon_unknown_7::PcMaker::PcMaker(PcMaker *this,Context *orig)

{
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::pair<const_int_&,_true>
            (&this->res,&orig->flags,(Vec<unsigned_int> *)&local_28);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_28);
  this->orig = orig;
  (this->res).first.mark = orig->mark;
  return;
}

Assistant:

PcMaker( const Context *orig ) : res{ orig->flags, {} }, orig{ orig } {
        res.first.mark = orig->mark;
    }